

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tree.c
# Opt level: O0

int xmlBufferGrow(xmlBufferPtr buf,uint len)

{
  long lVar1;
  xmlChar *pxVar2;
  uint local_38;
  uint local_34;
  size_t start_buf;
  xmlChar *newbuf;
  uint size;
  uint len_local;
  xmlBufferPtr buf_local;
  
  if (buf == (xmlBufferPtr)0x0) {
    buf_local._4_4_ = -1;
  }
  else if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) {
    buf_local._4_4_ = 0;
  }
  else if (len < buf->size - buf->use) {
    buf_local._4_4_ = 0;
  }
  else if (len < -buf->use - 1) {
    if (len < buf->size) {
      if (buf->size < 0x80000000) {
        local_34 = buf->size << 1;
      }
      else {
        local_34 = 0xffffffff;
      }
      newbuf._0_4_ = local_34;
    }
    else {
      local_38 = buf->use + len;
      if (local_38 < 0xffffff9c) {
        local_38 = local_38 + 100;
      }
      else {
        local_38 = 0xffffffff;
      }
      newbuf._0_4_ = local_38;
    }
    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != (xmlChar *)0x0)) {
      lVar1 = (long)buf->content - (long)buf->contentIO;
      pxVar2 = (xmlChar *)(*xmlRealloc)(buf->contentIO,lVar1 + (ulong)(uint)newbuf);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlTreeErrMemory("growing buffer");
        return -1;
      }
      buf->contentIO = pxVar2;
      buf->content = pxVar2 + lVar1;
    }
    else {
      pxVar2 = (xmlChar *)(*xmlRealloc)(buf->content,(size_t)(uint)newbuf);
      if (pxVar2 == (xmlChar *)0x0) {
        xmlTreeErrMemory("growing buffer");
        return -1;
      }
      buf->content = pxVar2;
    }
    buf->size = (uint)newbuf;
    buf_local._4_4_ = (buf->size - buf->use) + -1;
  }
  else {
    xmlTreeErrMemory("growing buffer past UINT_MAX");
    buf_local._4_4_ = -1;
  }
  return buf_local._4_4_;
}

Assistant:

int
xmlBufferGrow(xmlBufferPtr buf, unsigned int len) {
    unsigned int size;
    xmlChar *newbuf;

    if (buf == NULL) return(-1);

    if (buf->alloc == XML_BUFFER_ALLOC_IMMUTABLE) return(0);
    if (len < buf->size - buf->use)
        return(0);
    if (len >= UINT_MAX - buf->use) {
        xmlTreeErrMemory("growing buffer past UINT_MAX");
        return(-1);
    }

    if (buf->size > (size_t) len) {
        size = buf->size > UINT_MAX / 2 ? UINT_MAX : buf->size * 2;
    } else {
        size = buf->use + len;
        size = size > UINT_MAX - 100 ? UINT_MAX : size + 100;
    }

    if ((buf->alloc == XML_BUFFER_ALLOC_IO) && (buf->contentIO != NULL)) {
        size_t start_buf = buf->content - buf->contentIO;

	newbuf = (xmlChar *) xmlRealloc(buf->contentIO, start_buf + size);
	if (newbuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return(-1);
	}
	buf->contentIO = newbuf;
	buf->content = newbuf + start_buf;
    } else {
	newbuf = (xmlChar *) xmlRealloc(buf->content, size);
	if (newbuf == NULL) {
	    xmlTreeErrMemory("growing buffer");
	    return(-1);
	}
	buf->content = newbuf;
    }
    buf->size = size;
    return(buf->size - buf->use - 1);
}